

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::mmap_cache_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,mmap_cache_alert *this)

{
  uint uVar1;
  error_category *peVar2;
  char msg [600];
  string sStack_2b8;
  string local_298;
  char local_278 [600];
  
  uVar1 = (this->error).val_;
  peVar2 = (this->error).cat_;
  (*peVar2->_vptr_error_category[4])(&sStack_2b8,peVar2,(ulong)uVar1);
  convert_from_native(&local_298,&sStack_2b8);
  snprintf(local_278,600,"mmap cache failed: (%d) %s",(ulong)uVar1,local_298._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&sStack_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_278,(allocator<char> *)&local_298);
  return __return_storage_ptr__;
}

Assistant:

std::string mmap_cache_alert::message() const
	{
		char msg[600];
		std::snprintf(msg, sizeof(msg), "mmap cache failed: (%d) %s", error.value()
			, convert_from_native(error.message()).c_str());
		return msg;
	}